

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall FSinglePicFont::FSinglePicFont(FSinglePicFont *this,char *picname)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  FTextureID FVar4;
  char *pcVar5;
  FTexture *pFVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  
  (this->super_FFont).Ranges.Array = (FRemapTable *)0x0;
  (this->super_FFont).Ranges.Most = 0;
  (this->super_FFont).Ranges.Count = 0;
  (this->super_FFont).Lump = -1;
  (this->super_FFont).Chars = (CharData *)0x0;
  (this->super_FFont).PatchRemap = (BYTE *)0x0;
  (this->super_FFont).Name = (char *)0x0;
  (this->super_FFont).Cursor = '_';
  (this->super_FFont)._vptr_FFont = (_func_int **)&PTR__FFont_006ff098;
  FVar4 = FTextureManager::CheckForTexture(&TexMan,picname,0,1);
  if (FVar4.texnum < 1) {
    I_FatalError("%s is not a font or texture",picname);
  }
  if ((uint)FVar4.texnum < TexMan.Textures.Count) {
    pFVar6 = TexMan.Textures.Array[FVar4.texnum].Texture;
  }
  else {
    pFVar6 = (FTexture *)0x0;
  }
  pcVar5 = copystring(picname);
  (this->super_FFont).Name = pcVar5;
  uVar7._0_2_ = pFVar6->Width;
  uVar7._2_2_ = pFVar6->Height;
  uVar7._4_2_ = pFVar6->WidthMask;
  uVar7._6_2_ = *(undefined2 *)&pFVar6->field_0x3e;
  auVar1._8_4_ = 0;
  auVar1._0_8_ = uVar7;
  auVar1._12_2_ = uVar7._6_2_;
  auVar2._8_2_ = uVar7._4_2_;
  auVar2._0_8_ = uVar7;
  auVar2._10_4_ = auVar1._10_4_;
  auVar3._6_8_ = 0;
  auVar3._0_6_ = auVar2._8_6_;
  auVar8._0_8_ = (double)((uint)(ushort)(undefined2)uVar7 * 2);
  auVar8._8_8_ = (double)((int)CONCAT82(SUB148(auVar3 << 0x40,6),uVar7._2_2_) * 2);
  auVar8 = divpd(auVar8,(undefined1  [16])pFVar6->Scale);
  uVar7 = CONCAT44((int)auVar8._8_8_,(int)auVar8._0_8_) & 0x100000001;
  (this->super_FFont).SpaceWidth = (int)uVar7 + ((int)auVar8._0_8_ >> 1);
  (this->super_FFont).FontHeight = (int)(uVar7 >> 0x20) + ((int)auVar8._8_8_ >> 1);
  (this->super_FFont).GlobalKerning = 0;
  (this->super_FFont).FirstChar = 0x41;
  (this->super_FFont).LastChar = 0x41;
  (this->super_FFont).ActiveColors = 0;
  (this->PicNum).texnum = FVar4.texnum;
  (this->super_FFont).Next = FFont::FirstFont;
  FFont::FirstFont = &this->super_FFont;
  return;
}

Assistant:

FSinglePicFont::FSinglePicFont(const char *picname) :
	FFont(-1) // Since lump is only needed for priority information we don't need to worry about this here.
{
	FTextureID picnum = TexMan.CheckForTexture (picname, FTexture::TEX_Any);

	if (!picnum.isValid())
	{
		I_FatalError ("%s is not a font or texture", picname);
	}

	FTexture *pic = TexMan[picnum];

	Name = copystring(picname);
	FontHeight = pic->GetScaledHeight();
	SpaceWidth = pic->GetScaledWidth();
	GlobalKerning = 0;
	FirstChar = LastChar = 'A';
	ActiveColors = 0;
	PicNum = picnum;

	Next = FirstFont;
	FirstFont = this;
}